

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall cmMakefileTargetGenerator::WriteCommonCodeRules(cmMakefileTargetGenerator *this)

{
  cmMakefile *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  Encoding EVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  cmGeneratedFileStream *this_01;
  char *path;
  char *path_00;
  char *path_01;
  char *pcVar7;
  allocator local_2d1;
  string local_2d0;
  string local_2b0;
  string dependFileNameFull;
  cmGeneratedFileStream depFileStream;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string
            ((string *)&depFileStream,"CMAKE_MAKE_INCLUDE_FROM_ROOT",
             (allocator *)&dependFileNameFull);
  bVar2 = cmMakefile::IsOn(this_00,(string *)&depFileStream);
  pcVar7 = "";
  if (bVar2) {
    pcVar7 = "$(CMAKE_BINARY_DIR)/";
  }
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::string
            ((string *)&dependFileNameFull,(string *)&this->TargetBuildDirectoryFull);
  std::__cxx11::string::append((char *)&dependFileNameFull);
  poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                           "# Include any dependencies generated for this target.\n");
  poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
  poVar4 = std::operator<<(poVar4," ");
  poVar4 = std::operator<<(poVar4,pcVar7);
  pcVar1 = this->LocalGenerator;
  pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
  std::__cxx11::string::string((string *)&local_2d0,pcVar5,&local_2d1);
  cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
            (&local_2b0,pcVar1,&local_2d0,&dependFileNameFull);
  cmSystemTools::ConvertToOutputPath_abi_cxx11_
            ((string *)&depFileStream,(cmSystemTools *)local_2b0._M_dataplus._M_p,path);
  poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
  std::operator<<(poVar4,"\n\n");
  std::__cxx11::string::~string((string *)&depFileStream);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (this->NoRuleMessages == false) {
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the progress variables for this target.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    pcVar1 = this->LocalGenerator;
    pcVar5 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::__cxx11::string::string((string *)&local_2d0,pcVar5,&local_2d1);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath
              (&local_2b0,pcVar1,&local_2d0,&this->ProgressFileNameFull);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              ((string *)&depFileStream,(cmSystemTools *)local_2b0._M_dataplus._M_p,path_00);
    poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  bVar2 = cmsys::SystemTools::FileExists(dependFileNameFull._M_dataplus._M_p);
  if (!bVar2) {
    EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              (&depFileStream,dependFileNameFull._M_dataplus._M_p,false,EVar3);
    poVar4 = std::operator<<((ostream *)&depFileStream,"# Empty dependencies file for ");
    psVar6 = cmGeneratorTarget::GetName_abi_cxx11_
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    poVar4 = std::operator<<(poVar4,(string *)psVar6);
    poVar4 = std::operator<<(poVar4,".\n");
    poVar4 = std::operator<<(poVar4,"# This may be replaced when dependencies are built.");
    std::endl<char,std::char_traits<char>>(poVar4);
    cmGeneratedFileStream::~cmGeneratedFileStream(&depFileStream);
  }
  psVar6 = &this->FlagFileNameFull;
  std::__cxx11::string::_M_assign((string *)psVar6);
  std::__cxx11::string::append((char *)psVar6);
  this_01 = (cmGeneratedFileStream *)operator_new(0x248);
  pcVar5 = (this->FlagFileNameFull)._M_dataplus._M_p;
  EVar3 = (*(this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream(this_01,pcVar5,false,EVar3);
  this->FlagFileStream = this_01;
  cmGeneratedFileStream::SetCopyIfDifferent(this_01,true);
  if (this->FlagFileStream != (cmGeneratedFileStream *)0x0) {
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              (this->LocalGenerator,(ostream *)this->FlagFileStream);
    poVar4 = std::operator<<((ostream *)this->BuildFileStream,
                             "# Include the compile flags for this target\'s objects.\n");
    poVar4 = std::operator<<(poVar4,(string *)&this->GlobalGenerator->IncludeDirective);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,pcVar7);
    pcVar1 = this->LocalGenerator;
    pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)pcVar1);
    std::__cxx11::string::string((string *)&local_2d0,pcVar7,&local_2d1);
    cmLocalUnixMakefileGenerator3::MaybeConvertToRelativePath(&local_2b0,pcVar1,&local_2d0,psVar6);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              ((string *)&depFileStream,(cmSystemTools *)local_2b0._M_dataplus._M_p,path_01);
    poVar4 = std::operator<<(poVar4,(string *)&depFileStream);
    std::operator<<(poVar4,"\n\n");
    std::__cxx11::string::~string((string *)&depFileStream);
    std::__cxx11::string::~string((string *)&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  std::__cxx11::string::~string((string *)&dependFileNameFull);
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteCommonCodeRules()
{
  const char* root = (this->Makefile->IsOn("CMAKE_MAKE_INCLUDE_FROM_ROOT")
                        ? "$(CMAKE_BINARY_DIR)/"
                        : "");

  // Include the dependencies for the target.
  std::string dependFileNameFull = this->TargetBuildDirectoryFull;
  dependFileNameFull += "/depend.make";
  *this->BuildFileStream
    << "# Include any dependencies generated for this target.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(), dependFileNameFull)
           .c_str())
    << "\n\n";

  if (!this->NoRuleMessages) {
    // Include the progress variables for the target.
    *this->BuildFileStream
      << "# Include the progress variables for this target.\n"
      << this->GlobalGenerator->IncludeDirective << " " << root
      << cmSystemTools::ConvertToOutputPath(
           this->LocalGenerator
             ->MaybeConvertToRelativePath(
               this->LocalGenerator->GetBinaryDirectory(),
               this->ProgressFileNameFull)
             .c_str())
      << "\n\n";
  }

  // make sure the depend file exists
  if (!cmSystemTools::FileExists(dependFileNameFull.c_str())) {
    // Write an empty dependency file.
    cmGeneratedFileStream depFileStream(
      dependFileNameFull.c_str(), false,
      this->GlobalGenerator->GetMakefileEncoding());
    depFileStream << "# Empty dependencies file for "
                  << this->GeneratorTarget->GetName() << ".\n"
                  << "# This may be replaced when dependencies are built."
                  << std::endl;
  }

  // Open the flags file.  This should be copy-if-different because the
  // rules may depend on this file itself.
  this->FlagFileNameFull = this->TargetBuildDirectoryFull;
  this->FlagFileNameFull += "/flags.make";
  this->FlagFileStream =
    new cmGeneratedFileStream(this->FlagFileNameFull.c_str(), false,
                              this->GlobalGenerator->GetMakefileEncoding());
  this->FlagFileStream->SetCopyIfDifferent(true);
  if (!this->FlagFileStream) {
    return;
  }
  this->LocalGenerator->WriteDisclaimer(*this->FlagFileStream);

  // Include the flags for the target.
  *this->BuildFileStream
    << "# Include the compile flags for this target's objects.\n"
    << this->GlobalGenerator->IncludeDirective << " " << root
    << cmSystemTools::ConvertToOutputPath(
         this->LocalGenerator
           ->MaybeConvertToRelativePath(
             this->LocalGenerator->GetBinaryDirectory(),
             this->FlagFileNameFull)
           .c_str())
    << "\n\n";
}